

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  int iVar2;
  u32 uVar3;
  int n;
  sqlite3_vtab *psVar4;
  char *pcVar5;
  u8 *a;
  u32 uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  u32 nData;
  ulong uVar13;
  sqlite3_module *psVar14;
  sqlite3_vtab *psVar15;
  int iOff;
  i64 iPos;
  int local_5c;
  i64 local_58;
  sqlite3_vtab *local_50;
  int local_44;
  Fts5Buffer *local_40;
  Fts5IndexIter *local_38;
  
  psVar15 = pCursor->pVtab;
  local_44 = 0;
  psVar14 = pCursor[2].pVtab[1].pModule;
  iVar2 = *(int *)&psVar14->xBestIndex;
  uVar13 = (ulong)iVar2;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  iVar8 = psVar15[2].nRef;
  if (iVar8 == 0) {
    uVar11 = (ulong)*(int *)&pCursor[7].pVtab;
    iVar10 = *(int *)&pCursor[7].pVtab + 1;
    uVar12 = uVar11;
    if (iVar10 < iVar2) {
      iVar10 = iVar2;
    }
    do {
      if ((long)uVar13 <= (long)(uVar12 + 1)) {
        *(int *)&pCursor[7].pVtab = iVar10;
        goto LAB_001d97e4;
      }
      uVar9 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar9;
      lVar7 = uVar12 * 2;
      uVar12 = uVar12 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar7) == 0);
    *(uint *)&pCursor[7].pVtab = uVar9;
    if ((int)uVar9 < iVar2) {
      if (*(int *)&pCursor[3].pVtab != 0) {
        return 0;
      }
      goto LAB_001d97ff;
    }
  }
  else if (iVar8 == 2) {
    iVar2 = *(int *)((long)&psVar14->xColumn + 4);
    psVar15 = pCursor[4].pVtab;
    do {
      if ((iVar2 != 1) &&
         (iVar8 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar15->nRef,*(int *)&psVar15->zErrMsg,(int *)(pCursor + 0xe)
                             ,(i64 *)(pCursor + 0xd)), iVar8 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar8 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar8 != 0) break;
      iVar8 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if (iVar2 == 1) {
        return iVar8;
      }
      if (*(int *)&pCursor[3].pVtab != 0) {
        return iVar8;
      }
    } while (iVar8 == 0);
    *(undefined4 *)&pCursor[3].pVtab = 1;
    return iVar8;
  }
LAB_001d97e4:
  psVar4 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar4->zErrMsg + 4) == '\0') {
    pcVar5 = psVar4[(ulong)*(ushort *)(psVar4[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    nData = *(int *)&psVar4[(ulong)*(ushort *)(psVar4[3].zErrMsg + 4) * 5 + 8].pModule - 1;
    uVar3 = *(u32 *)&pCursor[5].pVtab;
    if (-1 < (int)uVar3) {
      uVar6 = uVar3;
      if ((int)nData < (int)uVar3) {
        uVar6 = nData;
      }
      iVar8 = memcmp(pCursor[6].pVtab,pcVar5 + 1,(long)(int)uVar6);
      if ((iVar8 < 0) || ((int)uVar3 < (int)nData && iVar8 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    *(undefined4 *)&pCursor[0xc].pVtab = 0;
    local_50 = psVar15;
    sqlite3Fts5BufferAppendBlob(&local_44,(Fts5Buffer *)(pCursor + 0xb),nData,(u8 *)(pcVar5 + 1));
    memset(pCursor[8].pVtab,0,uVar13 * 8);
    memset(pCursor[9].pVtab,0,uVar13 * 8);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    if (local_44 != 0) {
      return local_44;
    }
    iVar8 = local_50[2].nRef;
    psVar15 = local_50;
    local_40 = (Fts5Buffer *)(pCursor + 0xb);
    do {
      iVar10 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      local_58 = 0;
      local_5c = 0;
      local_38 = (Fts5IndexIter *)pCursor[4].pVtab;
      a = local_38->pData;
      n = local_38->nData;
      if (iVar8 == 0) {
        if (iVar10 == 0) {
          iVar8 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          if (iVar8 == 0) {
            iVar8 = -1;
            do {
              iVar10 = (int)((ulong)local_58 >> 0x20);
              if (iVar8 != iVar10) {
                if (iVar2 <= iVar10) {
                  return 0x10b;
                }
                ppsVar1 = &(pCursor[9].pVtab)->pModule + (local_58 >> 0x20);
                *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                iVar8 = iVar10;
              }
              ppsVar1 = &(pCursor[8].pVtab)->pModule + (local_58 >> 0x20);
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
              iVar10 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
            } while (iVar10 == 0);
          }
        }
        else {
          if (iVar10 != 2) goto LAB_001d99f1;
          iVar8 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          psVar15 = local_50;
          while (iVar8 == 0) {
            if ((long)uVar13 <= local_58) {
              return 0x10b;
            }
            ppsVar1 = &(pCursor[9].pVtab)->pModule + local_58;
            *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
            iVar8 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          }
        }
      }
      else if (iVar8 == 1) {
        if ((iVar10 == 0) && (iVar8 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58), iVar8 == 0)
           ) {
          psVar15 = pCursor[8].pVtab;
          psVar14 = psVar15->pModule;
          do {
            psVar14 = (sqlite3_module *)((long)&psVar14->iVersion + 1);
            psVar15->pModule = psVar14;
            iVar8 = sqlite3Fts5PoslistNext64(a,n,&local_5c,&local_58);
          } while (iVar8 == 0);
        }
LAB_001d99f1:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
        psVar15 = local_50;
      }
      iVar10 = sqlite3Fts5IterNextScan(local_38);
      iVar8 = psVar15[2].nRef;
      if (iVar8 == 2) {
        if (iVar10 != 0) {
          return iVar10;
        }
        iVar8 = 2;
        goto LAB_001d97f5;
      }
      if (iVar10 != 0) {
        return iVar10;
      }
      psVar4 = pCursor[4].pVtab;
      uVar9 = *(int *)&psVar4[(ulong)*(ushort *)(psVar4[3].zErrMsg + 4) * 5 + 8].pModule - 1;
      if ((uVar9 != *(uint *)&pCursor[0xc].pVtab) ||
         (((1 < *(int *)&psVar4[(ulong)*(ushort *)(psVar4[3].zErrMsg + 4) * 5 + 8].pModule &&
           (iVar10 = bcmp(psVar4[(ulong)*(ushort *)(psVar4[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                          local_40->p,(ulong)uVar9), iVar10 != 0)) ||
          (*(char *)((long)&psVar4->zErrMsg + 4) != '\0')))) goto LAB_001d97f5;
    } while( true );
  }
  *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001d97f5:
  if (iVar8 != 0 || *(int *)&pCursor[3].pVtab != 0) {
    return 0;
  }
LAB_001d97ff:
  uVar9 = *(uint *)&pCursor[7].pVtab;
  uVar12 = (ulong)uVar9;
  if ((int)uVar9 < iVar2) {
    uVar12 = (ulong)(int)uVar9;
    do {
      if ((&(pCursor[9].pVtab)->pModule)[uVar12] != (sqlite3_module *)0x0) goto LAB_001d988c;
      iVar8 = (int)uVar12;
      uVar12 = uVar12 + 1;
      *(int *)&pCursor[7].pVtab = iVar8 + 1;
    } while (uVar13 != uVar12);
  }
  else {
LAB_001d988c:
    if ((int)uVar12 != iVar2) {
      return 0;
    }
  }
  return 0x10b;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}